

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::ValueType::SerializeWithCachedSizes
          (ValueType *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ValueType *this_local;
  
  bVar1 = has_tensortype(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->type_).tensortype_)->super_MessageLite,output);
  }
  bVar1 = has_listtype(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->type_).tensortype_)->super_MessageLite,output);
  }
  bVar1 = has_tupletype(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->type_).tensortype_)->super_MessageLite,output);
  }
  bVar1 = has_dictionarytype(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->type_).tensortype_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void ValueType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.ValueType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorType tensorType = 1;
  if (has_tensortype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *type_.tensortype_, output);
  }

  // .CoreML.Specification.MILSpec.ListType listType = 2;
  if (has_listtype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *type_.listtype_, output);
  }

  // .CoreML.Specification.MILSpec.TupleType tupleType = 3;
  if (has_tupletype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *type_.tupletype_, output);
  }

  // .CoreML.Specification.MILSpec.DictionaryType dictionaryType = 4;
  if (has_dictionarytype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *type_.dictionarytype_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.ValueType)
}